

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall
helics::CommonCore::createBasicHandle
          (CommonCore *this,GlobalFederateId global_federateId,LocalFederateId param_2,
          InterfaceType HandleType,string_view key,string_view type,string_view units,uint16_t flags
          )

{
  BasicHandleInfo *pBVar1;
  shared_mutex *__rwlock;
  
  __rwlock = &(this->handles).m_mutex;
  std::__shared_mutex_pthread::lock(&__rwlock->_M_impl);
  pBVar1 = HandleManager::addHandle
                     (&(this->handles).m_obj,global_federateId,HandleType,key,type,units);
  (pBVar1->local_fed_id).fid = param_2.fid;
  pBVar1->flags = flags;
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return (_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)pBVar1;
}

Assistant:

const BasicHandleInfo& CommonCore::createBasicHandle(GlobalFederateId global_federateId,
                                                     LocalFederateId local_federateId,
                                                     InterfaceType HandleType,
                                                     std::string_view key,
                                                     std::string_view type,
                                                     std::string_view units,
                                                     uint16_t flags)
{
    return handles.modify([&](auto& hand) -> const BasicHandleInfo& {
        auto& hndl = hand.addHandle(global_federateId, HandleType, key, type, units);
        hndl.local_fed_id = local_federateId;
        hndl.flags = flags;
        return hndl;
    });
}